

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O0

yy_state_type __thiscall yyFlexLexer::yy_get_previous_state(yyFlexLexer *this)

{
  byte local_21;
  byte *pbStack_20;
  YY_CHAR yy_c;
  char *yy_cp;
  yy_state_type yy_current_state;
  yyFlexLexer *this_local;
  
  yy_cp._4_4_ = this->yy_start;
  for (pbStack_20 = (byte *)(this->super_FlexLexer).yytext; pbStack_20 < this->yy_c_buf_p;
      pbStack_20 = pbStack_20 + 1) {
    if (*pbStack_20 == 0) {
      local_21 = 1;
    }
    else {
      local_21 = ""[*pbStack_20];
    }
    if (yy_accept[yy_cp._4_4_] != 0) {
      this->yy_last_accepting_state = yy_cp._4_4_;
      this->yy_last_accepting_cpos = (char *)pbStack_20;
    }
    while (yy_chk[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_21)] != yy_cp._4_4_) {
      yy_cp._4_4_ = (int)yy_def[yy_cp._4_4_];
      if (0x436 < yy_cp._4_4_) {
        local_21 = ""[local_21];
      }
    }
    yy_cp._4_4_ = (int)yy_nxt[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_21)];
  }
  return yy_cp._4_4_;
}

Assistant:

yy_state_type yyFlexLexer::yy_get_previous_state()
/* %endif */
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
/* %% [15.0] code to get the start state into yy_current_state goes here */
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
/* %% [16.0] code to find the next state goes here */
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 1079 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}